

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::InvalidateCachedOuterScopes(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  Scope *pSVar5;
  FuncInfo *pFVar6;
  FuncInfo *func;
  Scope *pSStack_20;
  uint32 envIndex;
  Scope *scope;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  RVar3 = FuncInfo::GetEnvRegister(funcInfo);
  if (RVar3 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x857,"(funcInfo->GetEnvRegister() != Js::Constants::NoRegister)",
                       "funcInfo->GetEnvRegister() != Js::Constants::NoRegister");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar5 = FuncInfo::GetBodyScope(funcInfo);
  pSStack_20 = Scope::GetEnclosingScope(pSVar5);
  func._4_4_ = 0;
  while( true ) {
    bVar2 = false;
    if (pSStack_20 != (Scope *)0x0) {
      pFVar6 = Scope::GetFunc(pSStack_20);
      bVar2 = pFVar6 == funcInfo;
    }
    if (!bVar2) break;
    pSStack_20 = Scope::GetEnclosingScope(pSStack_20);
  }
  do {
    if (pSStack_20 == (Scope *)0x0) {
      return;
    }
    pFVar6 = Scope::GetFunc(pSStack_20);
    pSVar5 = FuncInfo::GetBodyScope(pFVar6);
    if (((pSStack_20 == pSVar5) && (bVar2 = FuncInfo::Escapes(pFVar6), bVar2)) &&
       (bVar2 = FuncInfo::GetHasCachedScope(pFVar6), bVar2)) {
      bVar2 = Scope::GetIsObject(pSStack_20);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x86b,"(scope->GetIsObject())","scope->GetIsObject()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      Js::ByteCodeWriter::Unsigned1(&this->m_writer,InvalCachedScope,func._4_4_);
    }
    bVar2 = Scope::GetMustInstantiate(pSStack_20);
    if (bVar2) {
      func._4_4_ = func._4_4_ + 1;
    }
    pSStack_20 = Scope::GetEnclosingScope(pSStack_20);
  } while( true );
}

Assistant:

void ByteCodeGenerator::InvalidateCachedOuterScopes(FuncInfo *funcInfo)
{
    Assert(funcInfo->GetEnvRegister() != Js::Constants::NoRegister);

    // Walk the scope stack, from funcInfo outward, looking for scopes that have been cached.

    Scope *scope = funcInfo->GetBodyScope()->GetEnclosingScope();
    uint32 envIndex = 0;

    while (scope && scope->GetFunc() == funcInfo)
    {
        // Skip over FuncExpr Scope and parameter scope for current funcInfo to get to the first enclosing scope of the outer function.
        scope = scope->GetEnclosingScope();
    }

    for (; scope; scope = scope->GetEnclosingScope())
    {
        FuncInfo *func = scope->GetFunc();
        if (scope == func->GetBodyScope())
        {
            if (func->Escapes() && func->GetHasCachedScope())
            {
                AssertOrFailFast(scope->GetIsObject());
                this->m_writer.Unsigned1(Js::OpCode::InvalCachedScope, envIndex);
            }
        }
        if (scope->GetMustInstantiate())
        {
            envIndex++;
        }
    }
}